

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall HighsSymmetryDetection::createNode(HighsSymmetryDetection *this)

{
  size_type sVar1;
  reference pvVar2;
  vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_> *in_RDI;
  
  std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>::
  emplace_back<>(in_RDI);
  sVar1 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)
                     &in_RDI[0xb].
                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  pvVar2 = std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ::back(in_RDI);
  pvVar2->stackStart = (HighsInt)sVar1;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &in_RDI[0x11].
                      super__Vector_base<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  pvVar2 = std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ::back(in_RDI);
  pvVar2->certificateEnd = (HighsInt)sVar1;
  pvVar2 = std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ::back(in_RDI);
  pvVar2->targetCell = -1;
  pvVar2 = std::vector<HighsSymmetryDetection::Node,_std::allocator<HighsSymmetryDetection::Node>_>
           ::back(in_RDI);
  pvVar2->lastDistiguished = -1;
  return;
}

Assistant:

void HighsSymmetryDetection::createNode() {
  nodeStack.emplace_back();
  nodeStack.back().stackStart = cellCreationStack.size();
  nodeStack.back().certificateEnd = currNodeCertificate.size();
  nodeStack.back().targetCell = -1;
  nodeStack.back().lastDistiguished = -1;
}